

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

LY_ERR lyht_find_rec(ly_ht *ht,void *val_p,uint32_t hash,ly_bool mod,lyht_value_equal_cb val_equal,
                    uint32_t *col,ly_ht_rec **rec_p)

{
  uint32_t uVar1;
  ly_bool lVar2;
  uint32_t local_4c;
  ly_ht_rec *plStack_48;
  uint32_t rec_idx;
  ly_ht_rec *rec;
  uint32_t hlist_idx;
  uint32_t *col_local;
  lyht_value_equal_cb val_equal_local;
  ly_bool mod_local;
  uint32_t hash_local;
  void *val_p_local;
  ly_ht *ht_local;
  
  uVar1 = ht->size;
  if (col != (uint32_t *)0x0) {
    *col = 0;
  }
  local_4c = ht->hlists[hash & uVar1 - 1].first;
  plStack_48 = lyht_get_rec(ht->recs,ht->rec_size,local_4c);
  while( true ) {
    if (local_4c == 0xffffffff) {
      *rec_p = (ly_ht_rec *)0x0;
      return LY_ENOTFOUND;
    }
    if ((plStack_48->hash == hash) &&
       (lVar2 = (*val_equal)(val_p,plStack_48->val,mod,ht->cb_data), lVar2 != '\0')) break;
    if (col != (uint32_t *)0x0) {
      *col = *col + 1;
    }
    local_4c = plStack_48->next;
    plStack_48 = lyht_get_rec(ht->recs,ht->rec_size,local_4c);
  }
  *rec_p = plStack_48;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyht_find_rec(const struct ly_ht *ht, void *val_p, uint32_t hash, ly_bool mod, lyht_value_equal_cb val_equal,
        uint32_t *col, struct ly_ht_rec **rec_p)
{
    uint32_t hlist_idx = hash & (ht->size - 1);
    struct ly_ht_rec *rec;
    uint32_t rec_idx;

    if (col) {
        *col = 0;
    }

    LYHT_ITER_HLIST_RECS(ht, hlist_idx, rec_idx, rec) {
        if ((rec->hash == hash) && val_equal(val_p, &rec->val, mod, ht->cb_data)) {
            *rec_p = rec;
            return LY_SUCCESS;
        }

        if (col) {
            *col = *col + 1;
        }
    }

    /* not found even in collisions */
    *rec_p = NULL;
    return LY_ENOTFOUND;
}